

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O0

void Jinx::Impl::ConvertUtf32ToUtf8
               (char32_t utf32CodePoint,char *utf8Out,size_t outBufferCount,size_t *numCharsOut)

{
  byte bVar1;
  size_t *numCharsOut_local;
  size_t outBufferCount_local;
  char *utf8Out_local;
  char32_t utf32CodePoint_local;
  
  if (((utf8Out == (char *)0x0) || (outBufferCount == 0)) || (numCharsOut == (size_t *)0x0)) {
    LogWriteLine(Error,"Invalid arguments passed to ConvertUtf32ToUtf8()");
  }
  else {
    *numCharsOut = 1;
    bVar1 = (byte)utf32CodePoint;
    if ((uint)utf32CodePoint < 0x80) {
      *utf8Out = bVar1 & 0x7f;
      *numCharsOut = 1;
    }
    else if ((uint)utf32CodePoint < 0x800) {
      if (outBufferCount < 2) {
        LogWriteLine(Error,"Invalid arguments passed to ConvertUtf32ToUtf8()");
      }
      else {
        *utf8Out = (byte)((uint)utf32CodePoint >> 6) | 0xc0;
        utf8Out[1] = bVar1 & 0x3f | 0x80;
        *numCharsOut = 2;
      }
    }
    else if ((uint)utf32CodePoint < 0x10000) {
      if (outBufferCount < 3) {
        LogWriteLine(Error,"Invalid arguments passed to ConvertUtf32ToUtf8()");
      }
      else {
        *utf8Out = (byte)((uint)utf32CodePoint >> 0xc) & 0xf | 0xe0;
        utf8Out[1] = (byte)((uint)utf32CodePoint >> 6) & 0x3f | 0x80;
        utf8Out[2] = bVar1 & 0x3f | 0x80;
        *numCharsOut = 3;
      }
    }
    else if ((uint)utf32CodePoint < 0x110000) {
      if (outBufferCount < 4) {
        LogWriteLine(Error,"Invalid arguments passed to ConvertUtf32ToUtf8()");
      }
      else {
        *utf8Out = (byte)((uint)utf32CodePoint >> 0x12) & 7 | 0xf0;
        utf8Out[1] = (byte)((uint)utf32CodePoint >> 0xc) & 0x3f | 0x80;
        utf8Out[2] = (byte)((uint)utf32CodePoint >> 6) & 0x3f | 0x80;
        utf8Out[3] = bVar1 & 0x3f | 0x80;
        *numCharsOut = 4;
      }
    }
    else {
      LogWriteLine(Error,"Invalid character data passed to function ConvertUtf32ToUtf8()");
    }
  }
  return;
}

Assistant:

inline_t void ConvertUtf32ToUtf8(char32_t utf32CodePoint, char * utf8Out, size_t outBufferCount, size_t * numCharsOut)
	{
		// Validate parameters
		if (!utf8Out || outBufferCount == 0 || !numCharsOut)
		{
			LogWriteLine(LogLevel::Error, "Invalid arguments passed to ConvertUtf32ToUtf8()");
			return;
		}

		// Initialize output
		*numCharsOut = 1;

		// Check for all four conversion cases
		if (utf32CodePoint < 0x80)
		{
			utf8Out[0] = char(utf32CodePoint & 0x7F);
			*numCharsOut = 1;
		}
		else if (utf32CodePoint < 0x0800)
		{
			if (outBufferCount < 2)
			{
				LogWriteLine(LogLevel::Error, "Invalid arguments passed to ConvertUtf32ToUtf8()");
				return;
			}
			utf8Out[0] = uint8_t(utf32CodePoint >> 6) | 0xC0;
			utf8Out[1] = (uint8_t(utf32CodePoint >> 0) & 0x3F) | 0x80;
			*numCharsOut = 2;
		}
		else if (utf32CodePoint < 0x010000)
		{
			if (outBufferCount < 3)
			{
				LogWriteLine(LogLevel::Error, "Invalid arguments passed to ConvertUtf32ToUtf8()");
				return;
			}
			utf8Out[0] = (uint8_t(utf32CodePoint >> 12) & 0x0F) | 0xE0;
			utf8Out[1] = (uint8_t(utf32CodePoint >> 6) & 0x3F) | 0x80;
			utf8Out[2] = (uint8_t(utf32CodePoint >> 0) & 0x3F) | 0x80;
			*numCharsOut = 3;
		}
		else if (utf32CodePoint < 0x110000)
		{
			if (outBufferCount < 4)
			{
				LogWriteLine(LogLevel::Error, "Invalid arguments passed to ConvertUtf32ToUtf8()");
				return;
			}
			utf8Out[0] = (uint8_t(utf32CodePoint >> 18) & 0x07) | 0xF0;
			utf8Out[1] = (uint8_t(utf32CodePoint >> 12) & 0x3F) | 0x80;
			utf8Out[2] = (uint8_t(utf32CodePoint >> 6) & 0x3F) | 0x80;
			utf8Out[3] = (uint8_t(utf32CodePoint >> 0) & 0x3F) | 0x80;
			*numCharsOut = 4;
		}
		else
		{
			// Invalid data
			LogWriteLine(LogLevel::Error, "Invalid character data passed to function ConvertUtf32ToUtf8()");
		}
	}